

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Enum
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  long lVar1;
  Type *descriptor;
  
  if ((0 < *(int *)(enm + 4)) && (*(int *)(*(long *)(enm + 0x28) + 4) != 0)) {
    lVar1 = *(long *)(enm + 8);
    descriptor = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                           (&(proto->value_).super_RepeatedPtrFieldBase,0);
    AddError(this,(string *)(lVar1 + 0x20),&descriptor->super_Message,NUMBER,
             "The first enum value must be zero in proto3.");
    return;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Enum(EnumDescriptor* enm,
                                           const EnumDescriptorProto& proto) {
  if (enm->value_count() > 0 && enm->value(0)->number() != 0) {
    AddError(enm->full_name(), proto.value(0),
             DescriptorPool::ErrorCollector::NUMBER,
             "The first enum value must be zero in proto3.");
  }
}